

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll(BlendMaskStateMachine *this)

{
  bool bVar1;
  uint idx;
  ulong uVar2;
  ulong uVar3;
  
  idx = 0;
  do {
    uVar2 = (ulong)idx;
    uVar3 = (long)(this->state).
                  super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->state).
                  super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar3 <= uVar2) break;
    bVar1 = CheckBuffer(this,idx);
    idx = idx + 1;
  } while (bVar1);
  return uVar3 <= uVar2;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll()
{
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		if (!CheckBuffer(i))
		{
			return false;
		}
	}
	return true;
}